

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::PoolingLayerParams::ByteSizeLong(PoolingLayerParams *this)

{
  int iVar1;
  uint32 uVar2;
  long lVar3;
  uint uVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  
  iVar1 = (this->kernelsize_).current_size_;
  iVar11 = 0;
  if (iVar1 < 1) {
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,iVar11);
      lVar8 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      lVar10 = lVar10 + (ulong)((int)lVar8 * 9 + 0x49U >> 6);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
  }
  uVar4 = (uint)lVar10;
  if (lVar10 == 0) {
    uVar7 = 0;
  }
  else if ((int)uVar4 < 0) {
    uVar7 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_kernelsize_cached_byte_size_ = uVar4;
  iVar1 = (this->stride_).current_size_;
  iVar11 = 0;
  if (iVar1 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,iVar11);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      iVar11 = iVar11 + 1;
    } while (iVar1 != iVar11);
  }
  lVar10 = uVar7 + lVar10;
  uVar4 = (uint)lVar8;
  if (lVar8 != 0) {
    if ((int)uVar4 < 0) {
      uVar7 = 0xc;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 2);
    }
    lVar10 = lVar10 + uVar7;
  }
  this->_stride_cached_byte_size_ = uVar4;
  sVar9 = lVar10 + lVar8;
  uVar4 = this->type_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  sVar6 = sVar9 + 3;
  if (this->avgpoolexcludepadding_ == false) {
    sVar6 = sVar9;
  }
  sVar9 = sVar6 + 3;
  if (this->globalpooling_ == false) {
    sVar9 = sVar6;
  }
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 0x20) {
    sVar6 = PoolingLayerParams_ValidCompletePadding::ByteSizeLong
                      ((this->PoolingPaddingType_).includelastpixel_);
  }
  else {
    if (uVar2 == 0x1f) {
      uVar4 = ((this->PoolingPaddingType_).same_)->asymmetrymode_;
      if (uVar4 == 0) {
        uVar7 = 0;
      }
      else if ((int)uVar4 < 0) {
        uVar7 = 0xb;
      }
      else {
        iVar1 = 0x1f;
        if ((uVar4 | 1) != 0) {
          for (; (uVar4 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      ((this->PoolingPaddingType_).same_)->_cached_size_ = (int)uVar7;
      sVar9 = sVar9 + uVar7 + 3;
      goto LAB_002187e3;
    }
    if (uVar2 != 0x1e) goto LAB_002187e3;
    sVar6 = ValidPadding::ByteSizeLong((this->PoolingPaddingType_).valid_);
  }
  uVar4 = (uint)sVar6 | 1;
  iVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar9 = sVar9 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_002187e3:
  this->_cached_size_ = (int)sVar9;
  return sVar9;
}

Assistant:

size_t PoolingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PoolingLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 10;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    total_size += 2 + 1;
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    total_size += 2 + 1;
  }

  switch (PoolingPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 30;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 31;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.same_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
    case kIncludeLastPixel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.includelastpixel_);
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}